

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

int Mvc_CoverSupportSizeBinary(Mvc_Cover_t *pCover)

{
  byte bVar1;
  uint uVar2;
  Mvc_Cube_t *pSupp;
  ulong uVar3;
  uint uVar4;
  
  pSupp = Mvc_CubeAlloc(pCover);
  Mvc_CoverSupportAnd(pCover,pSupp);
  uVar3 = (long)pCover->nBits / 2;
  uVar2 = (uint)uVar3;
  uVar3 = uVar3 & 0xffffffff;
  bVar1 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = (ulong)((int)uVar3 - (uint)((~pSupp->pData[uVar4 >> 4] >> (bVar1 & 0x1e) & 3) == 0));
    bVar1 = bVar1 + 2;
  }
  Mvc_CubeFree(pCover,pSupp);
  return (int)uVar3;
}

Assistant:

int Mvc_CoverSupportSizeBinary( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pSupp;
    int Counter, i, v0, v1;
    // compute the support
    pSupp = Mvc_CubeAlloc( pCover );
    Mvc_CoverSupportAnd( pCover, pSupp );
    Counter = pCover->nBits/2;
    for ( i = 0; i < pCover->nBits/2; i++ )
    {
        v0 = Mvc_CubeBitValue( pSupp, 2*i   );
        v1 = Mvc_CubeBitValue( pSupp, 2*i+1 );
        if ( v0 && v1 )
            Counter--;
    }
    Mvc_CubeFree( pCover, pSupp );
    return Counter;
}